

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O2

void __thiscall pass_zero_input_port1_Test::TestBody(pass_zero_input_port1_Test *this)

{
  bool bVar1;
  int iVar2;
  Generator *this_00;
  Port *pPVar3;
  Port *pPVar4;
  Generator *this_01;
  undefined4 extraout_var;
  undefined1 local_1e8 [8];
  Context c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  shared_ptr<kratos::Stmt> local_b8;
  shared_ptr<kratos::Stmt> local_a8;
  Port *local_98;
  undefined1 local_90 [8];
  shared_ptr<kratos::Attribute> attr;
  shared_ptr<kratos::Generator> local_78 [2];
  AssertHelper local_58;
  undefined1 local_50 [32];
  
  kratos::Context::Context((Context *)local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"module1",(allocator<char> *)local_78);
  this_00 = kratos::Context::generator((Context *)local_1e8,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"in",(allocator<char> *)local_78);
  pPVar3 = kratos::Generator::port(this_00,In,(string *)local_50,2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"out",(allocator<char> *)local_78);
  pPVar4 = kratos::Generator::port(this_00,Out,(string *)local_50,2);
  std::__cxx11::string::~string((string *)local_50);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_78,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar3->super_Var).super_enable_shared_from_this<kratos::Var>);
  local_98 = pPVar4;
  kratos::Var::assign((Var *)local_50,(shared_ptr<kratos::Var> *)pPVar4);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)local_50._0_8_;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt
            (this_00,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78[0].super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"module2",(allocator<char> *)local_78);
  this_01 = kratos::Context::generator((Context *)local_1e8,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"in",(allocator<char> *)local_78);
  kratos::Generator::port(this_01,In,(string *)local_50,1);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"out",(allocator<char> *)local_78);
  pPVar4 = kratos::Generator::port(this_01,Out,(string *)local_50,2);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"mod",(allocator<char> *)local_90);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_78,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_00->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator(this_01,(string *)local_50,local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78[0].super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_50);
  iVar2 = (*(pPVar3->super_Var).super_IRNode._vptr_IRNode[9])(pPVar3,0);
  kratos::Var::assign((Var *)local_50,(Var *)CONCAT44(extraout_var,iVar2));
  local_b8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50._0_8_;
  local_b8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_01,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  kratos::Var::assign((Var *)local_50,&pPVar4->super_Var);
  local_a8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50._0_8_;
  local_a8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
  local_50._0_8_ = (pointer)0x0;
  local_50._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt(this_01,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::make_shared<kratos::Attribute>();
  std::__cxx11::string::assign((char *)((long)local_90 + 8));
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)&(this_01->super_IRNode).attributes_,(shared_ptr<kratos::Attribute> *)local_90);
  local_50._16_8_ = 0;
  local_50._24_8_ = 0;
  local_50._8_8_ = (pointer)0x0;
  local_50._0_8_ = local_50 + 0x10;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    kratos::verify_generator_connectivity(this_01);
  }
  std::__cxx11::string::assign(local_50);
  testing::Message::Message((Message *)local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
             ,0x2d,(char *)local_50._0_8_);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (local_78[0].super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*((local_78[0].super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_IRNode)._vptr_IRNode[1])();
  }
  std::__cxx11::string::~string((string *)local_50);
  kratos::zero_generator_inputs(this_01);
  local_50._16_8_ = 0;
  local_50._24_8_ = 0;
  local_50._8_8_ = (pointer)0x0;
  local_50._0_8_ = local_50 + 0x10;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    kratos::verify_generator_connectivity(this_01);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attr);
  kratos::Context::~Context((Context *)local_1e8);
  return;
}

Assistant:

TEST(pass, zero_input_port1) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 2);
    auto &out1 = mod1.port(PortDirection::Out, "out", 2);
    mod1.add_stmt(out1.assign(in1.shared_from_this()));

    // the parent
    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 2);
    mod2.add_child_generator("mod", mod1.shared_from_this());
    mod2.add_stmt(in1[0].assign(in2));
    mod2.add_stmt(out2.assign(out1));

    // add attribute
    auto attr = std::make_shared<Attribute>();
    attr->type_str = "zero_inputs";
    mod2.add_attribute(attr);

    // this one won't pass
    EXPECT_THROW(verify_generator_connectivity(&mod2), StmtException);
    // now fix the connections
    zero_generator_inputs(&mod2);
    EXPECT_NO_THROW(verify_generator_connectivity(&mod2));
}